

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O1

void Bac_PtrFreeNtk(Vec_Ptr_t *vNtk)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  
  if (1 < vNtk->nSize) {
    pvVar1 = vNtk->pArray[1];
    if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
      free(*(void **)((long)pvVar1 + 8));
      *(undefined8 *)((long)pvVar1 + 8) = 0;
    }
    if (pvVar1 != (void *)0x0) {
      free(pvVar1);
    }
    if (2 < vNtk->nSize) {
      pvVar1 = vNtk->pArray[2];
      if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
        free(*(void **)((long)pvVar1 + 8));
        *(undefined8 *)((long)pvVar1 + 8) = 0;
      }
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
      }
      if (3 < vNtk->nSize) {
        pvVar1 = vNtk->pArray[3];
        if (0 < *(int *)((long)pvVar1 + 4)) {
          lVar3 = 0;
          do {
            pvVar2 = *(void **)(*(long *)((long)pvVar1 + 8) + lVar3 * 8);
            if (pvVar2 != (void *)0x0) {
              if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar2 + 8));
                *(undefined8 *)((long)pvVar2 + 8) = 0;
              }
              free(pvVar2);
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < *(int *)((long)pvVar1 + 4));
        }
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
          *(undefined8 *)((long)pvVar1 + 8) = 0;
        }
        if (pvVar1 != (void *)0x0) {
          free(pvVar1);
        }
        if (4 < vNtk->nSize) {
          pvVar1 = vNtk->pArray[4];
          if (0 < *(int *)((long)pvVar1 + 4)) {
            lVar3 = 0;
            do {
              pvVar2 = *(void **)(*(long *)((long)pvVar1 + 8) + lVar3 * 8);
              if (pvVar2 != (void *)0x0) {
                if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
                  free(*(void **)((long)pvVar2 + 8));
                  *(undefined8 *)((long)pvVar2 + 8) = 0;
                }
                free(pvVar2);
              }
              lVar3 = lVar3 + 1;
            } while (lVar3 < *(int *)((long)pvVar1 + 4));
          }
          if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar1 + 8));
            *(undefined8 *)((long)pvVar1 + 8) = 0;
          }
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
          if (5 < vNtk->nSize) {
            pvVar1 = vNtk->pArray[5];
            if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar1 + 8));
              *(undefined8 *)((long)pvVar1 + 8) = 0;
            }
            if (pvVar1 != (void *)0x0) {
              free(pvVar1);
            }
          }
          if (6 < vNtk->nSize) {
            pvVar1 = vNtk->pArray[6];
            if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
              free(*(void **)((long)pvVar1 + 8));
              *(undefined8 *)((long)pvVar1 + 8) = 0;
            }
            if (pvVar1 != (void *)0x0) {
              free(pvVar1);
            }
          }
          if (vNtk->pArray != (void **)0x0) {
            free(vNtk->pArray);
            vNtk->pArray = (void **)0x0;
          }
          if (vNtk != (Vec_Ptr_t *)0x0) {
            free(vNtk);
            return;
          }
          return;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Bac_PtrFreeNtk( Vec_Ptr_t * vNtk )
{
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 1) );
    Vec_PtrFree( (Vec_Ptr_t *)Vec_PtrEntry(vNtk, 2) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 3) );
    Vec_VecFree( (Vec_Vec_t *)Vec_PtrEntry(vNtk, 4) );
    if ( Vec_PtrSize(vNtk) > 5 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 5) );
    if ( Vec_PtrSize(vNtk) > 6 )
        Vec_FltFree( (Vec_Flt_t *)Vec_PtrEntry(vNtk, 6) );
    Vec_PtrFree( vNtk );
}